

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

Index wasm::Properties::getAlmostSignExtBits(Expression *curr,Index *extraLeftShifts)

{
  Expression *expr;
  Expression *expr_00;
  Index IVar1;
  Index IVar2;
  Binary *pBVar3;
  
  pBVar3 = Expression::cast<wasm::Binary>(curr);
  pBVar3 = Expression::cast<wasm::Binary>(pBVar3->left);
  expr = pBVar3->right;
  pBVar3 = Expression::cast<wasm::Binary>(curr);
  expr_00 = pBVar3->right;
  IVar1 = Bits::getEffectiveShifts(expr);
  IVar2 = Bits::getEffectiveShifts(expr_00);
  *extraLeftShifts = IVar1 - IVar2;
  IVar1 = getSignExtBits(curr);
  return IVar1;
}

Assistant:

inline Index getAlmostSignExtBits(Expression* curr, Index& extraLeftShifts) {
  auto* leftShift = curr->cast<Binary>()->left->cast<Binary>()->right;
  auto* rightShift = curr->cast<Binary>()->right;
  extraLeftShifts =
    Bits::getEffectiveShifts(leftShift) - Bits::getEffectiveShifts(rightShift);
  return getSignExtBits(curr);
}